

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

NeuralNetwork * addSoftmaxLayer(Model *m,char *name,char *input,char *output)

{
  NeuralNetwork *pNVar1;
  Type *this;
  SoftmaxLayerParams *this_00;
  
  if (m->_oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    pNVar1 = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(pNVar1);
    (m->Type_).neuralnetwork_ = pNVar1;
  }
  pNVar1 = (NeuralNetwork *)(m->Type_).pipeline_;
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (&(pNVar1->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::set_name(this,name);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,input);
  CoreML::Specification::NeuralNetworkLayer::add_output(this,output);
  if (this->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 0xaf;
    this_00 = (SoftmaxLayerParams *)operator_new(0x18);
    CoreML::Specification::SoftmaxLayerParams::SoftmaxLayerParams(this_00);
    (this->layer_).softmax_ = this_00;
  }
  return pNVar1;
}

Assistant:

Specification::NeuralNetwork* addSoftmaxLayer(Specification::Model& m, const char *name,  const char *input, const char *output) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto softmaxLayer = neuralNet->add_layers();
    
    softmaxLayer->set_name(name);
    softmaxLayer->add_input(input);
    softmaxLayer->add_output(output);
    softmaxLayer->mutable_softmax();
    
    return neuralNet;
}